

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_scalar.c
# Opt level: O2

void scalar_displace(t_gobj *z,_glist *glist,int dx,int dy)

{
  t_pd s;
  int iVar1;
  int iVar2;
  t_template *x;
  t_symbol *ptVar3;
  t_float tVar4;
  t_float tVar5;
  int yonset;
  int xonset;
  t_symbol *zz;
  int ytype;
  int xtype;
  t_gpointer gp;
  t_atom at [3];
  
  s = z[1].g_pd;
  x = template_findbyname((t_symbol *)s);
  if (x != (t_template *)0x0) {
    ptVar3 = gensym("x");
    iVar1 = template_find_field(x,ptVar3,&xonset,&xtype,&zz);
    ptVar3 = gensym("y");
    iVar2 = template_find_field(x,ptVar3,&yonset,&ytype,&zz);
    if ((iVar1 != 0) && (xtype == 0)) {
      iVar1 = glist->gl_zoom;
      tVar4 = glist_pixelstox(glist,1.0);
      tVar5 = glist_pixelstox(glist,0.0);
      *(float *)((long)&z[1].g_next + (long)xonset) =
           (tVar4 - tVar5) * (float)(iVar1 * dx) + *(float *)((long)&z[1].g_next + (long)xonset);
    }
    if ((iVar2 != 0) && (ytype == 0)) {
      iVar1 = glist->gl_zoom;
      tVar4 = glist_pixelstoy(glist,1.0);
      tVar5 = glist_pixelstoy(glist,0.0);
      *(float *)((long)&z[1].g_next + (long)yonset) =
           (tVar4 - tVar5) * (float)(iVar1 * dy) + *(float *)((long)&z[1].g_next + (long)yonset);
    }
    gp.gp_stub = (t_gstub *)0x0;
    gp.gp_valid = 0;
    gp.gp_un.gp_scalar = (_scalar *)0x0;
    gpointer_setglist(((t_symbol *)&gp).w_gpointer,glist,(t_scalar *)z);
    at[0].a_type = A_POINTER;
    at[1].a_w._0_4_ = (undefined4)dx;
    at[1].a_type = A_FLOAT;
    at[2].a_w._0_4_ = (undefined4)dy;
    at[0].a_w.w_symbol = ((t_symbol *)&gp).w_symbol;
    at[2].a_type = at[1].a_type;
    ptVar3 = gensym("displace");
    template_notify(x,ptVar3,2,at);
    scalar_redraw((t_scalar *)z,glist);
    return;
  }
  pd_error((void *)0x0,"scalar: couldn\'t find template %s",s->c_name);
  return;
}

Assistant:

static void scalar_displace(t_gobj *z, t_glist *glist, int dx, int dy)
{
    t_scalar *x = (t_scalar *)z;
    t_symbol *templatesym = x->sc_template;
    t_template *template = template_findbyname(templatesym);
    t_symbol *zz;
    t_atom at[3];
    t_gpointer gp;
    int xonset, yonset, xtype, ytype, gotx, goty;
    if (!template)
    {
        pd_error(0, "scalar: couldn't find template %s", templatesym->s_name);
        return;
    }
    gotx = template_find_field(template, gensym("x"), &xonset, &xtype, &zz);
    if (gotx && (xtype != DT_FLOAT))
        gotx = 0;
    goty = template_find_field(template, gensym("y"), &yonset, &ytype, &zz);
    if (goty && (ytype != DT_FLOAT))
        goty = 0;
    if (gotx)
        *(t_float *)(((char *)(x->sc_vec)) + xonset) +=
            glist->gl_zoom * dx * (glist_pixelstox(glist, 1) - glist_pixelstox(glist, 0));
    if (goty)
        *(t_float *)(((char *)(x->sc_vec)) + yonset) +=
            glist->gl_zoom * dy * (glist_pixelstoy(glist, 1) - glist_pixelstoy(glist, 0));
    gpointer_init(&gp);
    gpointer_setglist(&gp, glist, x);
    SETPOINTER(&at[0], &gp);
    SETFLOAT(&at[1], (t_float)dx);
    SETFLOAT(&at[2], (t_float)dy);
    template_notify(template, gensym("displace"), 2, at);
    scalar_redraw(x, glist);
}